

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O2

void TestSuite::sleep_ms(size_t ms,string *msg)

{
  duration<long,_std::ratio<1L,_1000L>_> local_10;
  
  if (msg->_M_string_length != 0) {
    _msg("%s (%zu ms)\n",(msg->_M_dataplus)._M_p,ms);
  }
  local_10.__r = ms;
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_10);
  return;
}

Assistant:

static void sleep_ms(size_t ms, const std::string& msg = std::string()) {
        if (!msg.empty()) TestSuite::_msg("%s (%zu ms)\n", msg.c_str(), ms);
        std::this_thread::sleep_for(std::chrono::milliseconds(ms));
    }